

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O3

void int_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                   JSAMPARRAY output_data)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  JSAMPROW pJVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  iVar8 = compptr->v_samp_factor;
  iVar7 = cinfo->max_h_samp_factor / compptr->h_samp_factor;
  iVar10 = compptr->width_in_blocks * 8;
  iVar1 = cinfo->max_v_samp_factor;
  uVar3 = iVar1 / iVar8;
  if (0 < (long)iVar1) {
    uVar2 = cinfo->image_width;
    if (0 < (int)(iVar7 * iVar10 - uVar2)) {
      lVar13 = 0;
      do {
        memset(input_data[lVar13] + uVar2,(uint)input_data[lVar13][(ulong)uVar2 - 1],
               (ulong)(iVar7 * iVar10 + ~uVar2) + 1);
        lVar13 = lVar13 + 1;
      } while (iVar1 != lVar13);
      iVar8 = compptr->v_samp_factor;
    }
  }
  if (0 < iVar8) {
    lVar13 = 0;
    lVar9 = 0;
    do {
      if (iVar10 != 0) {
        pJVar6 = output_data[lVar13];
        uVar12 = 0;
        iVar8 = 0;
        do {
          if ((int)uVar3 < 1) {
            lVar4 = 0;
          }
          else {
            uVar5 = 0;
            lVar4 = 0;
            do {
              if (0 < iVar7) {
                lVar11 = 0;
                do {
                  lVar4 = lVar4 + (ulong)input_data[lVar9 + uVar5][lVar11 + uVar12];
                  lVar11 = lVar11 + 1;
                } while (iVar7 != (int)lVar11);
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 != uVar3);
          }
          *pJVar6 = (JSAMPLE)((lVar4 + (int)(uVar3 * iVar7) / 2) / (long)(int)(uVar3 * iVar7));
          pJVar6 = pJVar6 + 1;
          iVar8 = iVar8 + 1;
          uVar12 = (ulong)(uint)((int)uVar12 + iVar7);
        } while (iVar8 != iVar10);
        iVar8 = compptr->v_samp_factor;
      }
      lVar9 = lVar9 + (int)uVar3;
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar8);
  }
  return;
}

Assistant:

METHODDEF(void)
int_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
               JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow, h_expand, v_expand, numpix, numpix2, h, v;
  JDIMENSION outcol, outcol_h;  /* outcol_h == outcol*h_expand */
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  JSAMPROW inptr, outptr;
  JLONG outvalue;

  h_expand = cinfo->max_h_samp_factor / compptr->h_samp_factor;
  v_expand = cinfo->max_v_samp_factor / compptr->v_samp_factor;
  numpix = h_expand * v_expand;
  numpix2 = numpix / 2;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor, cinfo->image_width,
                    output_cols * h_expand);

  inrow = 0;
  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    for (outcol = 0, outcol_h = 0; outcol < output_cols;
         outcol++, outcol_h += h_expand) {
      outvalue = 0;
      for (v = 0; v < v_expand; v++) {
        inptr = input_data[inrow + v] + outcol_h;
        for (h = 0; h < h_expand; h++) {
          outvalue += (JLONG)(*inptr++);
        }
      }
      *outptr++ = (JSAMPLE)((outvalue + numpix2) / numpix);
    }
    inrow += v_expand;
  }
}